

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  CURLsslset CVar1;
  int iVar2;
  Curl_ssl *backend;
  Curl_ssl **ppCVar3;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    if (available_backends[0] != (Curl_ssl *)0x0) {
      ppCVar3 = available_backends;
      backend = available_backends[0];
      do {
        ppCVar3 = ppCVar3 + 1;
        if ((backend->info).id == id) {
LAB_0014a2bf:
          multissl_init(backend);
          return CURLSSLSET_OK;
        }
        if ((name != (char *)0x0) &&
           (iVar2 = Curl_strcasecompare((backend->info).name,name), iVar2 != 0)) {
          backend = ppCVar3[-1];
          goto LAB_0014a2bf;
        }
        backend = *ppCVar3;
      } while (backend != (Curl_ssl *)0x0);
    }
    CVar1 = CURLSSLSET_UNKNOWN_BACKEND;
    if (avail != (curl_ssl_backend ***)0x0) {
      *avail = (curl_ssl_backend **)available_backends;
    }
  }
  else {
    CVar1 = (uint)((Curl_ssl->info).id != id) * 2;
  }
  return CVar1;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  int i;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ? CURLSSLSET_OK : CURLSSLSET_TOO_LATE;

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_init(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;
  return CURLSSLSET_UNKNOWN_BACKEND;
}